

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::End(void)

{
  ImVector<ImGuiWindow_*> *this;
  ImGuiWindow *window;
  ImGuiContext *pIVar1;
  value_type *ppIVar2;
  value_type window_00;
  
  pIVar1 = GImGui;
  window = GImGui->CurrentWindow;
  Columns(1,"#CloseColumns",true);
  PopClipRect();
  if ((window->Flags & 0x100000) == 0) {
    LogFinish();
  }
  this = &pIVar1->CurrentWindowStack;
  ImVector<ImGuiWindow_*>::pop_back(this);
  if ((window->Flags & 0x2000000) != 0) {
    ImVector<ImGuiPopupRef>::pop_back(&pIVar1->CurrentPopupStack);
  }
  window_00 = (ImGuiWindow *)0x0;
  CheckStacksSize(window,false);
  if (this->Size != 0) {
    ppIVar2 = ImVector<ImGuiWindow_*>::back(this);
    window_00 = *ppIVar2;
  }
  SetCurrentWindow(window_00);
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    Columns(1, "#CloseColumns");
    PopClipRect();   // inner window clip rectangle

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    // Pop
    // NB: we don't clear 'window->RootWindow'. The pointer is allowed to live until the next call to Begin().
    g.CurrentWindowStack.pop_back();
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.CurrentPopupStack.pop_back();
    CheckStacksSize(window, false);
    SetCurrentWindow(g.CurrentWindowStack.empty() ? NULL : g.CurrentWindowStack.back());
}